

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O0

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
duckdb::TableRef::Deserialize(Deserializer *deserializer)

{
  optional_idx deserializer_00;
  undefined8 uVar1;
  pointer pTVar2;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_> in_RDI;
  optional_idx query_location;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> sample;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> alias;
  TableReferenceType type;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *result;
  string *in_stack_fffffffffffffed8;
  SerializationException *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  field_id_t field_id;
  Deserializer *in_stack_fffffffffffffef0;
  optional_idx in_stack_fffffffffffffef8;
  allocator *paVar3;
  char *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  field_id_t field_id_00;
  __uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_> this;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  allocator in_stack_ffffffffffffff2f;
  string local_d0 [6];
  field_id_t in_stack_ffffffffffffff36;
  Deserializer *in_stack_ffffffffffffff38;
  Deserializer *in_stack_ffffffffffffff58;
  Deserializer *in_stack_ffffffffffffff68;
  Deserializer *in_stack_ffffffffffffff78;
  Deserializer *in_stack_ffffffffffffff88;
  optional_idx local_60;
  idx_t local_58;
  string local_38 [39];
  TableReferenceType local_11;
  
  field_id = (field_id_t)((ulong)in_stack_fffffffffffffee8 >> 0x30);
  field_id_00 = (field_id_t)((ulong)in_stack_ffffffffffffff10 >> 0x30);
  this._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
       (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
       in_RDI._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  local_11 = Deserializer::ReadProperty<duckdb::TableReferenceType>
                       (in_stack_fffffffffffffef0,field_id,(char *)in_stack_fffffffffffffee0);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff36,
             (char *)CONCAT17(in_stack_ffffffffffffff2f,
                              CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>>
            ((Deserializer *)
             this._M_t.
             super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
             super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl,field_id_00,
             in_stack_ffffffffffffff08);
  optional_idx::optional_idx(&local_60);
  deserializer_00 =
       Deserializer::ReadPropertyWithExplicitDefault<duckdb::optional_idx>
                 (in_stack_fffffffffffffef0,field_id,(char *)in_stack_fffffffffffffee0,
                  in_stack_fffffffffffffef8);
  local_58 = deserializer_00.index;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::unique_ptr
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)0xae8638);
  switch(local_11) {
  case BASE_TABLE:
    BaseTableRef::Deserialize(in_stack_ffffffffffffff58);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)0xae86ce
              );
    break;
  case SUBQUERY:
    SubqueryRef::Deserialize
              ((Deserializer *)
               CONCAT17(in_stack_ffffffffffffff2f,
                        CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)0xae8884
              );
    break;
  case JOIN:
    JoinRef::Deserialize(in_stack_ffffffffffffff88);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)0xae87d3
              );
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x10);
    paVar3 = (allocator *)&stack0xffffffffffffff2f;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_d0,"Unsupported type for deserialization of TableRef!",paVar3);
    SerializationException::SerializationException
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    __cxa_throw(uVar1,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  case TABLE_FUNCTION:
    TableFunctionRef::Deserialize
              ((Deserializer *)
               CONCAT17(in_stack_ffffffffffffff2f,
                        CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)0xae88b6
              );
    break;
  case EXPRESSION_LIST:
    ExpressionListRef::Deserialize(in_stack_ffffffffffffff38);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)0xae8798
              );
    break;
  case EMPTY_FROM:
    EmptyTableRef::Deserialize((Deserializer *)deserializer_00.index);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)0xae875d
              );
    break;
  case PIVOT:
    PivotRef::Deserialize(in_stack_ffffffffffffff78);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)0xae880e
              );
    break;
  case SHOW_REF:
    ShowRef::Deserialize(in_stack_ffffffffffffff38);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)0xae8849
              );
    break;
  case COLUMN_DATA:
    ColumnDataRef::Deserialize(in_stack_ffffffffffffff68);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)0xae8722
              );
  }
  pTVar2 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      in_stack_fffffffffffffee0);
  ::std::__cxx11::string::operator=((string *)&pTVar2->alias,local_38);
  pTVar2 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      in_stack_fffffffffffffee0);
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::operator=
            ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
             pTVar2,(unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                     *)in_stack_fffffffffffffed8);
  pTVar2 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      pTVar2);
  (pTVar2->query_location).index = local_58;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::~unique_ptr
            ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
             0xae8a16);
  ::std::__cxx11::string::~string(local_38);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (__uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         in_RDI._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
         ._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<TableRef> TableRef::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<TableReferenceType>(100, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(101, "alias");
	auto sample = deserializer.ReadPropertyWithDefault<unique_ptr<SampleOptions>>(102, "sample");
	auto query_location = deserializer.ReadPropertyWithExplicitDefault<optional_idx>(103, "query_location", optional_idx());
	unique_ptr<TableRef> result;
	switch (type) {
	case TableReferenceType::BASE_TABLE:
		result = BaseTableRef::Deserialize(deserializer);
		break;
	case TableReferenceType::COLUMN_DATA:
		result = ColumnDataRef::Deserialize(deserializer);
		break;
	case TableReferenceType::EMPTY_FROM:
		result = EmptyTableRef::Deserialize(deserializer);
		break;
	case TableReferenceType::EXPRESSION_LIST:
		result = ExpressionListRef::Deserialize(deserializer);
		break;
	case TableReferenceType::JOIN:
		result = JoinRef::Deserialize(deserializer);
		break;
	case TableReferenceType::PIVOT:
		result = PivotRef::Deserialize(deserializer);
		break;
	case TableReferenceType::SHOW_REF:
		result = ShowRef::Deserialize(deserializer);
		break;
	case TableReferenceType::SUBQUERY:
		result = SubqueryRef::Deserialize(deserializer);
		break;
	case TableReferenceType::TABLE_FUNCTION:
		result = TableFunctionRef::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of TableRef!");
	}
	result->alias = std::move(alias);
	result->sample = std::move(sample);
	result->query_location = query_location;
	return result;
}